

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerReporter
          (RegistryHub *this,string *name,IReporterFactoryPtr *factory)

{
  unique_ptr<Catch::IReporterFactory> *in_RDX;
  IReporterFactoryPtr *in_stack_000000d0;
  string *in_stack_000000d8;
  ReporterRegistry *in_stack_000000e0;
  unique_ptr<Catch::IReporterFactory> local_20 [4];
  
  Detail::unique_ptr<Catch::IReporterFactory>::unique_ptr(local_20,in_RDX);
  ReporterRegistry::registerReporter(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  Detail::unique_ptr<Catch::IReporterFactory>::~unique_ptr(in_RDX);
  return;
}

Assistant:

void registerReporter( std::string const& name, IReporterFactoryPtr factory ) override {
                m_reporterRegistry.registerReporter( name, CATCH_MOVE(factory) );
            }